

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  int *piVar1;
  undefined8 uVar2;
  void **ppvVar3;
  Mat *pMVar4;
  long *in_RSI;
  long in_RDI;
  bool bVar5;
  float top_blob_int8_scale;
  float bottom_blob_int8_scale_1;
  float weight_data_int8_scale;
  float bottom_blob_int8_scale;
  int i_3;
  float *ptr_3;
  int size_3;
  int i_2;
  float *ptr_2;
  int size_2;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Allocator *in_stack_fffffffffffff458;
  size_t in_stack_fffffffffffff460;
  Mat *pMVar6;
  undefined8 in_stack_fffffffffffff468;
  int iVar7;
  Mat *in_stack_fffffffffffff470;
  Mat local_a08;
  undefined4 local_9bc;
  void *local_9b8;
  int *local_9b0;
  undefined8 local_9a8;
  undefined4 local_9a0;
  long *local_998;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined8 local_978;
  void *local_970;
  int *local_968;
  undefined8 local_960;
  undefined4 local_958;
  long *local_950;
  undefined4 local_948;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined8 local_930;
  undefined4 local_924;
  void *local_920;
  int *local_918;
  undefined8 local_910;
  undefined4 local_908;
  long *local_900;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined8 local_8e0;
  undefined4 local_8d4;
  void *local_8d0;
  int *local_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  long *local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined8 local_890;
  void *local_888;
  int *local_880;
  undefined8 local_878;
  undefined4 local_870;
  long *local_868;
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined8 local_848;
  void *local_840;
  int *local_838;
  undefined8 local_830;
  undefined4 local_828;
  long *local_820;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined8 local_800;
  undefined4 local_7f4;
  void *local_7f0;
  int *local_7e8;
  undefined8 local_7e0;
  undefined4 local_7d8;
  long *local_7d0;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined8 local_7b0;
  void *local_7a8;
  int *local_7a0;
  undefined8 local_798;
  undefined4 local_790;
  long *local_788;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined8 local_768;
  void *local_760;
  int *local_758;
  undefined8 local_750;
  undefined4 local_748;
  long *local_740;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined8 local_720;
  void *local_708;
  int *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  long *local_6e8;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined8 local_6c8;
  long *local_6c0;
  int local_6ac;
  void **local_6a8;
  void **local_698;
  void **local_688;
  void **local_678;
  void **local_668;
  void **local_658;
  void **local_648;
  void **local_638;
  void **local_628;
  void **local_618;
  Mat *local_608;
  int local_5f8;
  undefined4 local_5f4;
  Mat *local_5f0;
  Mat *local_5e8;
  Mat *local_5e0;
  int local_5d8;
  undefined4 local_5d4;
  void **local_5d0;
  void **local_5c8;
  void **local_5c0;
  int local_5b8;
  undefined4 local_5b4;
  void **local_5b0;
  void **local_5a8;
  void **local_5a0;
  int local_598;
  undefined4 local_594;
  void **local_590;
  void **local_588;
  void **local_580;
  int local_578;
  undefined4 local_574;
  void **local_570;
  void **local_568;
  void **local_560;
  int local_558;
  undefined4 local_554;
  void **local_550;
  void **local_548;
  void **local_540;
  int local_538;
  undefined4 local_534;
  void **local_530;
  void **local_528;
  void **local_520;
  int local_518;
  undefined4 local_514;
  void **local_510;
  void **local_508;
  void **local_500;
  int local_4f8;
  undefined4 local_4f4;
  void **local_4f0;
  void **local_4e8;
  void **local_4e0;
  int local_4d8;
  undefined4 local_4d4;
  void **local_4d0;
  void **local_4c8;
  void **local_4c0;
  int local_4b8;
  undefined4 local_4b4;
  void **local_4b0;
  void **local_4a8;
  void **local_4a0;
  long *local_498;
  long *local_490;
  undefined8 local_488;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 *local_470;
  undefined8 local_468;
  undefined8 *local_460;
  undefined8 local_458;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined4 local_434;
  void **local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined4 local_414;
  void **local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined4 local_3f4;
  void **local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined4 local_3d4;
  Mat *local_3d0;
  int local_3c4;
  undefined4 *local_3c0;
  int local_3a4;
  undefined4 *local_3a0;
  int local_398;
  undefined4 local_394;
  undefined8 *local_390;
  int local_384;
  undefined4 *local_380;
  int local_378;
  undefined4 local_374;
  undefined8 *local_370;
  int local_364;
  undefined4 *local_360;
  int local_358;
  undefined4 local_354;
  undefined8 *local_350;
  int local_348;
  undefined4 local_344;
  void **local_340;
  int local_338;
  undefined4 local_334;
  void **local_330;
  int local_328;
  undefined4 local_324;
  void **local_320;
  int local_318;
  undefined4 local_314;
  void **local_310;
  int local_308;
  undefined4 local_304;
  void **local_300;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2d8;
  undefined4 local_2d4;
  void **local_2d0;
  int local_2c8;
  undefined4 local_2c4;
  void **local_2c0;
  int local_2b8;
  undefined4 local_2b4;
  void **local_2b0;
  int local_2a8;
  undefined4 local_2a4;
  Mat *local_2a0;
  int local_288;
  undefined4 local_284;
  Mat *local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  void **local_220;
  int local_208;
  undefined4 local_204;
  void **local_200;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  int local_188;
  undefined4 local_184;
  void **local_180;
  int local_168;
  undefined4 local_164;
  void **local_160;
  int local_148;
  undefined4 local_144;
  void **local_140;
  void *local_f8;
  void *local_c8;
  void *local_b8;
  void *local_98;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  long *local_10;
  long *local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffff468 >> 0x20);
  if (*(int *)(in_RDI + 0x160) == 0) {
    local_6c0 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(&local_708,in_RSI,*(undefined4 *)(in_RDI + 0x104),0);
    ppvVar3 = (void **)(in_RDI + 0x168);
    local_4b0 = &local_708;
    local_4a8 = ppvVar3;
    if (ppvVar3 != local_4b0) {
      if (local_700 != (int *)0x0) {
        local_4b4 = 1;
        LOCK();
        local_4b8 = *local_700;
        *local_700 = *local_700 + 1;
        UNLOCK();
      }
      local_340 = ppvVar3;
      if (*(long *)(in_RDI + 0x170) != 0) {
        piVar1 = *(int **)(in_RDI + 0x170);
        local_344 = 0xffffffff;
        LOCK();
        local_348 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_348 == 1) {
          if (*(long *)(in_RDI + 0x188) == 0) {
            local_38 = *ppvVar3;
            if (local_38 != (void *)0x0) {
              free(local_38);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*ppvVar3);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x178) = 0;
      *(undefined4 *)(in_RDI + 0x180) = 0;
      *(undefined4 *)(in_RDI + 400) = 0;
      *(undefined4 *)(in_RDI + 0x194) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined4 *)(in_RDI + 0x19c) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined8 *)(in_RDI + 0x1a8) = 0;
      *(undefined8 *)(in_RDI + 0x170) = 0;
      *ppvVar3 = *local_4b0;
      *(void **)(in_RDI + 0x170) = local_4b0[1];
      *(void **)(in_RDI + 0x178) = local_4b0[2];
      *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)(local_4b0 + 3);
      *(void **)(in_RDI + 0x188) = local_4b0[4];
      *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_4b0 + 5);
      *(undefined4 *)(in_RDI + 0x194) = *(undefined4 *)((long)local_4b0 + 0x2c);
      *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_4b0 + 6);
      *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_4b0 + 0x34);
      *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_4b0 + 7);
      *(void **)(in_RDI + 0x1a8) = local_4b0[8];
    }
    local_6a8 = &local_708;
    local_4a0 = ppvVar3;
    local_140 = local_6a8;
    if (local_700 != (int *)0x0) {
      local_144 = 0xffffffff;
      LOCK();
      local_148 = *local_700;
      *local_700 = *local_700 + -1;
      UNLOCK();
      if (local_148 == 1) {
        if (local_6e8 == (long *)0x0) {
          if (local_708 != (void *)0x0) {
            free(local_708);
          }
        }
        else {
          (**(code **)(*local_6e8 + 0x18))(local_6e8,local_708);
        }
      }
    }
    local_708 = (void *)0x0;
    local_6f8 = 0;
    local_6f0 = 0;
    local_6e0 = 0;
    local_6dc = 0;
    local_6d8 = 0;
    local_6d4 = 0;
    local_6d0 = 0;
    local_6c8 = 0;
    local_700 = (int *)0x0;
    local_490 = (long *)(in_RDI + 0x168);
    bVar5 = true;
    if (*local_490 != 0) {
      bVar5 = *(long *)(in_RDI + 0x1a8) * (long)*(int *)(in_RDI + 0x1a0) == 0;
      local_10 = local_490;
    }
    if (bVar5) {
      local_6ac = -100;
    }
    else {
      if (*(int *)(in_RDI + 0x100) != 0) {
        (**(code **)(*local_6c0 + 0x10))(&local_760,local_6c0,*(undefined4 *)(in_RDI + 0xd0),1);
        ppvVar3 = (void **)(in_RDI + 0x1b0);
        local_4d0 = &local_760;
        local_4c8 = ppvVar3;
        if (ppvVar3 != local_4d0) {
          if (local_758 != (int *)0x0) {
            local_4d4 = 1;
            LOCK();
            local_4d8 = *local_758;
            *local_758 = *local_758 + 1;
            UNLOCK();
          }
          local_330 = ppvVar3;
          if (*(long *)(in_RDI + 0x1b8) != 0) {
            piVar1 = *(int **)(in_RDI + 0x1b8);
            local_334 = 0xffffffff;
            LOCK();
            local_338 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_338 == 1) {
              if (*(long *)(in_RDI + 0x1d0) == 0) {
                local_40 = *ppvVar3;
                if (local_40 != (void *)0x0) {
                  free(local_40);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))
                          (*(long **)(in_RDI + 0x1d0),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x1c0) = 0;
          *(undefined4 *)(in_RDI + 0x1c8) = 0;
          *(undefined4 *)(in_RDI + 0x1d8) = 0;
          *(undefined4 *)(in_RDI + 0x1dc) = 0;
          *(undefined4 *)(in_RDI + 0x1e0) = 0;
          *(undefined4 *)(in_RDI + 0x1e4) = 0;
          *(undefined4 *)(in_RDI + 0x1e8) = 0;
          *(undefined8 *)(in_RDI + 0x1f0) = 0;
          *(undefined8 *)(in_RDI + 0x1b8) = 0;
          *ppvVar3 = *local_4d0;
          *(void **)(in_RDI + 0x1b8) = local_4d0[1];
          *(void **)(in_RDI + 0x1c0) = local_4d0[2];
          *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_4d0 + 3);
          *(void **)(in_RDI + 0x1d0) = local_4d0[4];
          *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_4d0 + 5);
          *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_4d0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_4d0 + 6);
          *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_4d0 + 0x34);
          *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_4d0 + 7);
          *(void **)(in_RDI + 0x1f0) = local_4d0[8];
        }
        local_698 = &local_760;
        local_4c0 = ppvVar3;
        local_160 = local_698;
        if (local_758 != (int *)0x0) {
          local_164 = 0xffffffff;
          LOCK();
          local_168 = *local_758;
          *local_758 = *local_758 + -1;
          UNLOCK();
          if (local_168 == 1) {
            if (local_740 == (long *)0x0) {
              if (local_760 != (void *)0x0) {
                free(local_760);
              }
            }
            else {
              (**(code **)(*local_740 + 0x18))(local_740,local_760);
            }
          }
        }
        local_760 = (void *)0x0;
        local_750 = 0;
        local_748 = 0;
        local_738 = 0;
        local_734 = 0;
        local_730 = 0;
        local_72c = 0;
        local_728 = 0;
        local_720 = 0;
        local_758 = (int *)0x0;
        local_498 = (long *)(in_RDI + 0x1b0);
        bVar5 = true;
        if (*local_498 != 0) {
          bVar5 = *(long *)(in_RDI + 0x1f0) * (long)*(int *)(in_RDI + 0x1e8) == 0;
          local_8 = local_498;
        }
        if (bVar5) {
          return -100;
        }
      }
      if ((*(int *)(in_RDI + 0x10c) == 1) || (*(int *)(in_RDI + 0x10c) == 0x65)) {
        (**(code **)(*local_6c0 + 0x10))(&local_7a8,local_6c0,*(undefined4 *)(in_RDI + 0x108),1);
        ppvVar3 = (void **)(in_RDI + 0x1f8);
        local_4f0 = &local_7a8;
        local_4e8 = ppvVar3;
        if (ppvVar3 != local_4f0) {
          if (local_7a0 != (int *)0x0) {
            local_4f4 = 1;
            LOCK();
            local_4f8 = *local_7a0;
            *local_7a0 = *local_7a0 + 1;
            UNLOCK();
          }
          local_320 = ppvVar3;
          if (*(long *)(in_RDI + 0x200) != 0) {
            piVar1 = *(int **)(in_RDI + 0x200);
            local_324 = 0xffffffff;
            LOCK();
            local_328 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_328 == 1) {
              if (*(long *)(in_RDI + 0x218) == 0) {
                local_48 = *ppvVar3;
                if (local_48 != (void *)0x0) {
                  free(local_48);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x218) + 0x18))
                          (*(long **)(in_RDI + 0x218),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x208) = 0;
          *(undefined4 *)(in_RDI + 0x210) = 0;
          *(undefined4 *)(in_RDI + 0x220) = 0;
          *(undefined4 *)(in_RDI + 0x224) = 0;
          *(undefined4 *)(in_RDI + 0x228) = 0;
          *(undefined4 *)(in_RDI + 0x22c) = 0;
          *(undefined4 *)(in_RDI + 0x230) = 0;
          *(undefined8 *)(in_RDI + 0x238) = 0;
          *(undefined8 *)(in_RDI + 0x200) = 0;
          *ppvVar3 = *local_4f0;
          *(void **)(in_RDI + 0x200) = local_4f0[1];
          *(void **)(in_RDI + 0x208) = local_4f0[2];
          *(undefined4 *)(in_RDI + 0x210) = *(undefined4 *)(local_4f0 + 3);
          *(void **)(in_RDI + 0x218) = local_4f0[4];
          *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_4f0 + 5);
          *(undefined4 *)(in_RDI + 0x224) = *(undefined4 *)((long)local_4f0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_4f0 + 6);
          *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)((long)local_4f0 + 0x34);
          *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_4f0 + 7);
          *(void **)(in_RDI + 0x238) = local_4f0[8];
        }
        local_688 = &local_7a8;
        local_4e0 = ppvVar3;
        local_180 = local_688;
        if (local_7a0 != (int *)0x0) {
          local_184 = 0xffffffff;
          LOCK();
          local_188 = *local_7a0;
          *local_7a0 = *local_7a0 + -1;
          UNLOCK();
          if (local_188 == 1) {
            if (local_788 == (long *)0x0) {
              if (local_7a8 != (void *)0x0) {
                free(local_7a8);
              }
            }
            else {
              (**(code **)(*local_788 + 0x18))(local_788,local_7a8);
            }
          }
        }
        local_7a8 = (void *)0x0;
        local_798 = 0;
        local_790 = 0;
        local_780 = 0;
        local_77c = 0;
        local_778 = 0;
        local_774 = 0;
        local_770 = 0;
        local_768 = 0;
        local_7a0 = (int *)0x0;
        (**(code **)(*local_6c0 + 0x10))(&local_7f0,local_6c0,1);
        ppvVar3 = (void **)(in_RDI + 0x240);
        local_510 = &local_7f0;
        local_508 = ppvVar3;
        if (ppvVar3 != local_510) {
          if (local_7e8 != (int *)0x0) {
            local_514 = 1;
            LOCK();
            local_518 = *local_7e8;
            *local_7e8 = *local_7e8 + 1;
            UNLOCK();
          }
          local_310 = ppvVar3;
          if (*(long *)(in_RDI + 0x248) != 0) {
            piVar1 = *(int **)(in_RDI + 0x248);
            local_314 = 0xffffffff;
            LOCK();
            local_318 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_318 == 1) {
              if (*(long *)(in_RDI + 0x260) == 0) {
                local_50 = *ppvVar3;
                if (local_50 != (void *)0x0) {
                  free(local_50);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x260) + 0x18))
                          (*(long **)(in_RDI + 0x260),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 600) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined4 *)(in_RDI + 0x274) = 0;
          *(undefined4 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x280) = 0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *ppvVar3 = *local_510;
          *(void **)(in_RDI + 0x248) = local_510[1];
          *(void **)(in_RDI + 0x250) = local_510[2];
          *(undefined4 *)(in_RDI + 600) = *(undefined4 *)(local_510 + 3);
          *(void **)(in_RDI + 0x260) = local_510[4];
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_510 + 5);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_510 + 0x2c);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_510 + 6);
          *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_510 + 0x34);
          *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_510 + 7);
          *(void **)(in_RDI + 0x280) = local_510[8];
        }
        local_678 = &local_7f0;
        local_500 = ppvVar3;
        local_1a0 = local_678;
        if (local_7e8 != (int *)0x0) {
          local_1a4 = 0xffffffff;
          LOCK();
          local_1a8 = *local_7e8;
          *local_7e8 = *local_7e8 + -1;
          UNLOCK();
          if (local_1a8 == 1) {
            if (local_7d0 == (long *)0x0) {
              if (local_7f0 != (void *)0x0) {
                free(local_7f0);
              }
            }
            else {
              (**(code **)(*local_7d0 + 0x18))(local_7d0,local_7f0);
            }
          }
        }
        local_7f0 = (void *)0x0;
        local_7e0 = 0;
        local_7d8 = 0;
        local_7c8 = 0;
        local_7c4 = 0;
        local_7c0 = 0;
        local_7bc = 0;
        local_7b8 = 0;
        local_7b0 = 0;
        local_7e8 = (int *)0x0;
        local_450 = (undefined8 *)(in_RDI + 0x240);
        local_458 = 0;
        local_7f4 = *(undefined4 *)*local_450;
        local_434 = *(undefined4 *)(in_RDI + 0x108);
        local_430 = &local_840;
        local_440 = 4;
        local_448 = 0;
        local_840 = (void *)0x0;
        local_838 = (int *)0x0;
        local_830 = 0;
        local_828 = 0;
        local_820 = (long *)0x0;
        local_818 = 0;
        local_814 = 0;
        local_810 = 0;
        local_80c = 0;
        local_808 = 0;
        local_800 = 0;
        Mat::create(in_stack_fffffffffffff470,iVar7,in_stack_fffffffffffff460,
                    in_stack_fffffffffffff458);
        ppvVar3 = (void **)(in_RDI + 0x240);
        local_530 = &local_840;
        local_528 = ppvVar3;
        if (ppvVar3 != local_530) {
          if (local_838 != (int *)0x0) {
            local_534 = 1;
            LOCK();
            local_538 = *local_838;
            *local_838 = *local_838 + 1;
            UNLOCK();
          }
          local_300 = ppvVar3;
          if (*(long *)(in_RDI + 0x248) != 0) {
            piVar1 = *(int **)(in_RDI + 0x248);
            local_304 = 0xffffffff;
            LOCK();
            local_308 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_308 == 1) {
              if (*(long *)(in_RDI + 0x260) == 0) {
                local_58 = *ppvVar3;
                if (local_58 != (void *)0x0) {
                  free(local_58);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x260) + 0x18))
                          (*(long **)(in_RDI + 0x260),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 600) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined4 *)(in_RDI + 0x274) = 0;
          *(undefined4 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x280) = 0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *ppvVar3 = *local_530;
          *(void **)(in_RDI + 0x248) = local_530[1];
          *(void **)(in_RDI + 0x250) = local_530[2];
          *(undefined4 *)(in_RDI + 600) = *(undefined4 *)(local_530 + 3);
          *(void **)(in_RDI + 0x260) = local_530[4];
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_530 + 5);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_530 + 0x2c);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_530 + 6);
          *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_530 + 0x34);
          *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_530 + 7);
          *(void **)(in_RDI + 0x280) = local_530[8];
        }
        local_668 = &local_840;
        local_520 = ppvVar3;
        local_1c0 = local_668;
        if (local_838 != (int *)0x0) {
          local_1c4 = 0xffffffff;
          LOCK();
          local_1c8 = *local_838;
          *local_838 = *local_838 + -1;
          UNLOCK();
          if (local_1c8 == 1) {
            if (local_820 == (long *)0x0) {
              local_f8 = local_840;
              if (local_840 != (void *)0x0) {
                free(local_840);
              }
            }
            else {
              (**(code **)(*local_820 + 0x18))(local_820,local_840);
            }
          }
        }
        local_840 = (void *)0x0;
        local_830 = 0;
        local_828 = 0;
        local_818 = 0;
        local_814 = 0;
        local_810 = 0;
        local_80c = 0;
        local_808 = 0;
        local_800 = 0;
        local_838 = (int *)0x0;
        local_350 = (undefined8 *)(in_RDI + 0x240);
        local_354 = local_7f4;
        local_358 = (int)*(undefined8 *)(in_RDI + 0x280) * *(int *)(in_RDI + 0x278);
        local_360 = (undefined4 *)*local_350;
        for (local_364 = 0; local_30 = local_350, local_364 < local_358; local_364 = local_364 + 1)
        {
          *local_360 = local_7f4;
          local_360 = local_360 + 1;
        }
      }
      else if ((*(int *)(in_RDI + 0x10c) == 2) || (*(int *)(in_RDI + 0x10c) == 0x66)) {
        (**(code **)(*local_6c0 + 0x10))(&local_888,local_6c0,1);
        ppvVar3 = (void **)(in_RDI + 0x1f8);
        local_550 = &local_888;
        local_548 = ppvVar3;
        if (ppvVar3 != local_550) {
          if (local_880 != (int *)0x0) {
            local_554 = 1;
            LOCK();
            local_558 = *local_880;
            *local_880 = *local_880 + 1;
            UNLOCK();
          }
          local_2f0 = ppvVar3;
          if (*(long *)(in_RDI + 0x200) != 0) {
            piVar1 = *(int **)(in_RDI + 0x200);
            local_2f4 = 0xffffffff;
            LOCK();
            local_2f8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_2f8 == 1) {
              if (*(long *)(in_RDI + 0x218) == 0) {
                local_60 = *ppvVar3;
                if (local_60 != (void *)0x0) {
                  free(local_60);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x218) + 0x18))
                          (*(long **)(in_RDI + 0x218),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x208) = 0;
          *(undefined4 *)(in_RDI + 0x210) = 0;
          *(undefined4 *)(in_RDI + 0x220) = 0;
          *(undefined4 *)(in_RDI + 0x224) = 0;
          *(undefined4 *)(in_RDI + 0x228) = 0;
          *(undefined4 *)(in_RDI + 0x22c) = 0;
          *(undefined4 *)(in_RDI + 0x230) = 0;
          *(undefined8 *)(in_RDI + 0x238) = 0;
          *(undefined8 *)(in_RDI + 0x200) = 0;
          *ppvVar3 = *local_550;
          *(void **)(in_RDI + 0x200) = local_550[1];
          *(void **)(in_RDI + 0x208) = local_550[2];
          *(undefined4 *)(in_RDI + 0x210) = *(undefined4 *)(local_550 + 3);
          *(void **)(in_RDI + 0x218) = local_550[4];
          *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_550 + 5);
          *(undefined4 *)(in_RDI + 0x224) = *(undefined4 *)((long)local_550 + 0x2c);
          *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_550 + 6);
          *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)((long)local_550 + 0x34);
          *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_550 + 7);
          *(void **)(in_RDI + 0x238) = local_550[8];
        }
        local_658 = &local_888;
        local_540 = ppvVar3;
        local_1e0 = local_658;
        if (local_880 != (int *)0x0) {
          local_1e4 = 0xffffffff;
          LOCK();
          local_1e8 = *local_880;
          *local_880 = *local_880 + -1;
          UNLOCK();
          if (local_1e8 == 1) {
            if (local_868 == (long *)0x0) {
              if (local_888 != (void *)0x0) {
                free(local_888);
              }
            }
            else {
              (**(code **)(*local_868 + 0x18))(local_868,local_888);
            }
          }
        }
        local_888 = (void *)0x0;
        local_878 = 0;
        local_870 = 0;
        local_860 = 0;
        local_85c = 0;
        local_858 = 0;
        local_854 = 0;
        local_850 = 0;
        local_848 = 0;
        local_880 = (int *)0x0;
        (**(code **)(*local_6c0 + 0x10))(&local_8d0,local_6c0,1);
        ppvVar3 = (void **)(in_RDI + 0x240);
        local_570 = &local_8d0;
        local_568 = ppvVar3;
        if (ppvVar3 != local_570) {
          if (local_8c8 != (int *)0x0) {
            local_574 = 1;
            LOCK();
            local_578 = *local_8c8;
            *local_8c8 = *local_8c8 + 1;
            UNLOCK();
          }
          local_2e0 = ppvVar3;
          if (*(long *)(in_RDI + 0x248) != 0) {
            piVar1 = *(int **)(in_RDI + 0x248);
            local_2e4 = 0xffffffff;
            LOCK();
            local_2e8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_2e8 == 1) {
              if (*(long *)(in_RDI + 0x260) == 0) {
                local_68 = *ppvVar3;
                if (local_68 != (void *)0x0) {
                  free(local_68);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x260) + 0x18))
                          (*(long **)(in_RDI + 0x260),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 600) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined4 *)(in_RDI + 0x274) = 0;
          *(undefined4 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x280) = 0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *ppvVar3 = *local_570;
          *(void **)(in_RDI + 0x248) = local_570[1];
          *(void **)(in_RDI + 0x250) = local_570[2];
          *(undefined4 *)(in_RDI + 600) = *(undefined4 *)(local_570 + 3);
          *(void **)(in_RDI + 0x260) = local_570[4];
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_570 + 5);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_570 + 0x2c);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_570 + 6);
          *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_570 + 0x34);
          *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_570 + 7);
          *(void **)(in_RDI + 0x280) = local_570[8];
        }
        local_648 = &local_8d0;
        local_560 = ppvVar3;
        local_200 = local_648;
        if (local_8c8 != (int *)0x0) {
          local_204 = 0xffffffff;
          LOCK();
          local_208 = *local_8c8;
          *local_8c8 = *local_8c8 + -1;
          UNLOCK();
          if (local_208 == 1) {
            if (local_8b0 == (long *)0x0) {
              if (local_8d0 != (void *)0x0) {
                free(local_8d0);
              }
            }
            else {
              (**(code **)(*local_8b0 + 0x18))(local_8b0,local_8d0);
            }
          }
        }
        local_8d0 = (void *)0x0;
        local_8c0 = 0;
        local_8b8 = 0;
        local_8a8 = 0;
        local_8a4 = 0;
        local_8a0 = 0;
        local_89c = 0;
        local_898 = 0;
        local_890 = 0;
        local_8c8 = (int *)0x0;
        local_460 = (undefined8 *)(in_RDI + 0x1f8);
        local_468 = 0;
        local_8d4 = *(undefined4 *)*local_460;
        local_414 = *(undefined4 *)(in_RDI + 0x108);
        local_410 = &local_920;
        local_420 = 4;
        local_428 = 0;
        local_920 = (void *)0x0;
        local_918 = (int *)0x0;
        local_910 = 0;
        local_908 = 0;
        local_900 = (long *)0x0;
        local_8f8 = 0;
        local_8f4 = 0;
        local_8f0 = 0;
        local_8ec = 0;
        local_8e8 = 0;
        local_8e0 = 0;
        Mat::create(in_stack_fffffffffffff470,iVar7,in_stack_fffffffffffff460,
                    in_stack_fffffffffffff458);
        ppvVar3 = (void **)(in_RDI + 0x1f8);
        local_590 = &local_920;
        local_588 = ppvVar3;
        if (ppvVar3 != local_590) {
          if (local_918 != (int *)0x0) {
            local_594 = 1;
            LOCK();
            local_598 = *local_918;
            *local_918 = *local_918 + 1;
            UNLOCK();
          }
          local_2d0 = ppvVar3;
          if (*(long *)(in_RDI + 0x200) != 0) {
            piVar1 = *(int **)(in_RDI + 0x200);
            local_2d4 = 0xffffffff;
            LOCK();
            local_2d8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_2d8 == 1) {
              if (*(long *)(in_RDI + 0x218) == 0) {
                local_70 = *ppvVar3;
                if (local_70 != (void *)0x0) {
                  free(local_70);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x218) + 0x18))
                          (*(long **)(in_RDI + 0x218),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x208) = 0;
          *(undefined4 *)(in_RDI + 0x210) = 0;
          *(undefined4 *)(in_RDI + 0x220) = 0;
          *(undefined4 *)(in_RDI + 0x224) = 0;
          *(undefined4 *)(in_RDI + 0x228) = 0;
          *(undefined4 *)(in_RDI + 0x22c) = 0;
          *(undefined4 *)(in_RDI + 0x230) = 0;
          *(undefined8 *)(in_RDI + 0x238) = 0;
          *(undefined8 *)(in_RDI + 0x200) = 0;
          *ppvVar3 = *local_590;
          *(void **)(in_RDI + 0x200) = local_590[1];
          *(void **)(in_RDI + 0x208) = local_590[2];
          *(undefined4 *)(in_RDI + 0x210) = *(undefined4 *)(local_590 + 3);
          *(void **)(in_RDI + 0x218) = local_590[4];
          *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_590 + 5);
          *(undefined4 *)(in_RDI + 0x224) = *(undefined4 *)((long)local_590 + 0x2c);
          *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_590 + 6);
          *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)((long)local_590 + 0x34);
          *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_590 + 7);
          *(void **)(in_RDI + 0x238) = local_590[8];
        }
        local_638 = &local_920;
        local_580 = ppvVar3;
        local_220 = local_638;
        if (local_918 != (int *)0x0) {
          local_224 = 0xffffffff;
          LOCK();
          local_228 = *local_918;
          *local_918 = *local_918 + -1;
          UNLOCK();
          if (local_228 == 1) {
            if (local_900 == (long *)0x0) {
              local_c8 = local_920;
              if (local_920 != (void *)0x0) {
                free(local_920);
              }
            }
            else {
              (**(code **)(*local_900 + 0x18))(local_900,local_920);
            }
          }
        }
        local_920 = (void *)0x0;
        local_910 = 0;
        local_908 = 0;
        local_8f8 = 0;
        local_8f4 = 0;
        local_8f0 = 0;
        local_8ec = 0;
        local_8e8 = 0;
        local_8e0 = 0;
        local_918 = (int *)0x0;
        local_370 = (undefined8 *)(in_RDI + 0x1f8);
        local_374 = local_8d4;
        local_378 = (int)*(undefined8 *)(in_RDI + 0x238) * *(int *)(in_RDI + 0x230);
        local_380 = (undefined4 *)*local_370;
        for (local_384 = 0; local_384 < local_378; local_384 = local_384 + 1) {
          *local_380 = local_8d4;
          local_380 = local_380 + 1;
        }
        local_470 = (undefined8 *)(in_RDI + 0x240);
        local_478 = 0;
        local_924 = *(undefined4 *)*local_470;
        local_3f4 = *(undefined4 *)(in_RDI + 0x108);
        local_3f0 = &local_970;
        local_400 = 4;
        local_408 = 0;
        local_970 = (void *)0x0;
        local_968 = (int *)0x0;
        local_960 = 0;
        local_958 = 0;
        local_950 = (long *)0x0;
        local_948 = 0;
        local_944 = 0;
        local_940 = 0;
        local_93c = 0;
        local_938 = 0;
        local_930 = 0;
        local_28 = local_370;
        Mat::create(in_stack_fffffffffffff470,iVar7,in_stack_fffffffffffff460,
                    in_stack_fffffffffffff458);
        ppvVar3 = (void **)(in_RDI + 0x240);
        local_5b0 = &local_970;
        local_5a8 = ppvVar3;
        if (ppvVar3 != local_5b0) {
          if (local_968 != (int *)0x0) {
            local_5b4 = 1;
            LOCK();
            local_5b8 = *local_968;
            *local_968 = *local_968 + 1;
            UNLOCK();
          }
          local_2c0 = ppvVar3;
          if (*(long *)(in_RDI + 0x248) != 0) {
            piVar1 = *(int **)(in_RDI + 0x248);
            local_2c4 = 0xffffffff;
            LOCK();
            local_2c8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_2c8 == 1) {
              if (*(long *)(in_RDI + 0x260) == 0) {
                local_78 = *ppvVar3;
                if (local_78 != (void *)0x0) {
                  free(local_78);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x260) + 0x18))
                          (*(long **)(in_RDI + 0x260),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 600) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined4 *)(in_RDI + 0x274) = 0;
          *(undefined4 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x280) = 0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *ppvVar3 = *local_5b0;
          *(void **)(in_RDI + 0x248) = local_5b0[1];
          *(void **)(in_RDI + 0x250) = local_5b0[2];
          *(undefined4 *)(in_RDI + 600) = *(undefined4 *)(local_5b0 + 3);
          *(void **)(in_RDI + 0x260) = local_5b0[4];
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_5b0 + 5);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_5b0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_5b0 + 6);
          *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_5b0 + 0x34);
          *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_5b0 + 7);
          *(void **)(in_RDI + 0x280) = local_5b0[8];
        }
        local_628 = &local_970;
        local_5a0 = ppvVar3;
        local_240 = local_628;
        if (local_968 != (int *)0x0) {
          local_244 = 0xffffffff;
          LOCK();
          local_248 = *local_968;
          *local_968 = *local_968 + -1;
          UNLOCK();
          if (local_248 == 1) {
            if (local_950 == (long *)0x0) {
              local_b8 = local_970;
              if (local_970 != (void *)0x0) {
                free(local_970);
              }
            }
            else {
              (**(code **)(*local_950 + 0x18))(local_950,local_970);
            }
          }
        }
        local_970 = (void *)0x0;
        local_960 = 0;
        local_958 = 0;
        local_948 = 0;
        local_944 = 0;
        local_940 = 0;
        local_93c = 0;
        local_938 = 0;
        local_930 = 0;
        local_968 = (int *)0x0;
        local_390 = (undefined8 *)(in_RDI + 0x240);
        local_394 = local_924;
        local_398 = (int)*(undefined8 *)(in_RDI + 0x280) * *(int *)(in_RDI + 0x278);
        local_3a0 = (undefined4 *)*local_390;
        for (local_3a4 = 0; local_20 = local_390, local_3a4 < local_398; local_3a4 = local_3a4 + 1)
        {
          *local_3a0 = local_924;
          local_3a0 = local_3a0 + 1;
        }
      }
      if (100 < *(int *)(in_RDI + 0x10c)) {
        (**(code **)(*local_6c0 + 0x10))(&local_9b8,local_6c0,1);
        ppvVar3 = (void **)(in_RDI + 0x288);
        local_5d0 = &local_9b8;
        local_5c8 = ppvVar3;
        if (ppvVar3 != local_5d0) {
          if (local_9b0 != (int *)0x0) {
            local_5d4 = 1;
            LOCK();
            local_5d8 = *local_9b0;
            *local_9b0 = *local_9b0 + 1;
            UNLOCK();
          }
          local_2b0 = ppvVar3;
          if (*(long *)(in_RDI + 0x290) != 0) {
            piVar1 = *(int **)(in_RDI + 0x290);
            local_2b4 = 0xffffffff;
            LOCK();
            local_2b8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_2b8 == 1) {
              if (*(long *)(in_RDI + 0x2a8) == 0) {
                local_80 = *ppvVar3;
                if (local_80 != (void *)0x0) {
                  free(local_80);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x2a8) + 0x18))
                          (*(long **)(in_RDI + 0x2a8),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x298) = 0;
          *(undefined4 *)(in_RDI + 0x2a0) = 0;
          *(undefined4 *)(in_RDI + 0x2b0) = 0;
          *(undefined4 *)(in_RDI + 0x2b4) = 0;
          *(undefined4 *)(in_RDI + 0x2b8) = 0;
          *(undefined4 *)(in_RDI + 700) = 0;
          *(undefined4 *)(in_RDI + 0x2c0) = 0;
          *(undefined8 *)(in_RDI + 0x2c8) = 0;
          *(undefined8 *)(in_RDI + 0x290) = 0;
          *ppvVar3 = *local_5d0;
          *(void **)(in_RDI + 0x290) = local_5d0[1];
          *(void **)(in_RDI + 0x298) = local_5d0[2];
          *(undefined4 *)(in_RDI + 0x2a0) = *(undefined4 *)(local_5d0 + 3);
          *(void **)(in_RDI + 0x2a8) = local_5d0[4];
          *(undefined4 *)(in_RDI + 0x2b0) = *(undefined4 *)(local_5d0 + 5);
          *(undefined4 *)(in_RDI + 0x2b4) = *(undefined4 *)((long)local_5d0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x2b8) = *(undefined4 *)(local_5d0 + 6);
          *(undefined4 *)(in_RDI + 700) = *(undefined4 *)((long)local_5d0 + 0x34);
          *(undefined4 *)(in_RDI + 0x2c0) = *(undefined4 *)(local_5d0 + 7);
          *(void **)(in_RDI + 0x2c8) = local_5d0[8];
        }
        local_618 = &local_9b8;
        local_5c0 = ppvVar3;
        local_260 = local_618;
        if (local_9b0 != (int *)0x0) {
          local_264 = 0xffffffff;
          LOCK();
          local_268 = *local_9b0;
          *local_9b0 = *local_9b0 + -1;
          UNLOCK();
          if (local_268 == 1) {
            if (local_998 == (long *)0x0) {
              if (local_9b8 != (void *)0x0) {
                free(local_9b8);
              }
            }
            else {
              (**(code **)(*local_998 + 0x18))(local_998,local_9b8);
            }
          }
        }
        local_9b8 = (void *)0x0;
        local_9a8 = 0;
        local_9a0 = 0;
        local_990 = 0;
        local_98c = 0;
        local_988 = 0;
        local_984 = 0;
        local_980 = 0;
        local_978 = 0;
        local_9b0 = (int *)0x0;
        local_480 = (undefined8 *)(in_RDI + 0x288);
        local_488 = 0;
        local_9bc = *(undefined4 *)*local_480;
        local_3d4 = *(undefined4 *)(in_RDI + 0x108);
        local_3d0 = &local_a08;
        local_3e0 = 4;
        local_3e8 = 0;
        local_a08.data = (void *)0x0;
        local_a08.refcount = (int *)0x0;
        local_a08.elemsize = 0;
        local_a08.elempack = 0;
        local_a08.allocator = (Allocator *)0x0;
        local_a08.dims = 0;
        local_a08.w = 0;
        local_a08.h = 0;
        local_a08.d = 0;
        local_a08.c = 0;
        local_a08.cstep = 0;
        Mat::create(local_3d0,iVar7,in_stack_fffffffffffff460,in_stack_fffffffffffff458);
        pMVar4 = (Mat *)(in_RDI + 0x288);
        local_5f0 = &local_a08;
        local_5e8 = pMVar4;
        if (pMVar4 != local_5f0) {
          if (local_a08.refcount != (int *)0x0) {
            local_5f4 = 1;
            LOCK();
            local_5f8 = *local_a08.refcount;
            *local_a08.refcount = *local_a08.refcount + 1;
            UNLOCK();
          }
          pMVar6 = pMVar4;
          local_2a0 = pMVar4;
          if (*(long *)(in_RDI + 0x290) != 0) {
            piVar1 = *(int **)(in_RDI + 0x290);
            local_2a4 = 0xffffffff;
            LOCK();
            local_2a8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_2a8 == 1) {
              if (*(long *)(in_RDI + 0x2a8) == 0) {
                local_88 = pMVar4->data;
                if (local_88 != (void *)0x0) {
                  free(local_88);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x2a8) + 0x18))
                          (*(long **)(in_RDI + 0x2a8),pMVar4->data);
              }
            }
          }
          pMVar6->data = (void *)0x0;
          pMVar6->elemsize = 0;
          pMVar6->elempack = 0;
          pMVar6->dims = 0;
          pMVar6->w = 0;
          pMVar6->h = 0;
          pMVar6->d = 0;
          pMVar6->c = 0;
          pMVar6->cstep = 0;
          pMVar6->refcount = (int *)0x0;
          pMVar4->data = local_5f0->data;
          *(int **)(in_RDI + 0x290) = local_5f0->refcount;
          *(size_t *)(in_RDI + 0x298) = local_5f0->elemsize;
          *(int *)(in_RDI + 0x2a0) = local_5f0->elempack;
          *(Allocator **)(in_RDI + 0x2a8) = local_5f0->allocator;
          *(int *)(in_RDI + 0x2b0) = local_5f0->dims;
          *(int *)(in_RDI + 0x2b4) = local_5f0->w;
          *(int *)(in_RDI + 0x2b8) = local_5f0->h;
          *(int *)(in_RDI + 700) = local_5f0->d;
          *(int *)(in_RDI + 0x2c0) = local_5f0->c;
          *(size_t *)(in_RDI + 0x2c8) = local_5f0->cstep;
        }
        pMVar6 = &local_a08;
        if (local_a08.refcount != (int *)0x0) {
          local_284 = 0xffffffff;
          LOCK();
          local_288 = *local_a08.refcount;
          *local_a08.refcount = *local_a08.refcount + -1;
          UNLOCK();
          if (local_288 == 1) {
            local_608 = pMVar6;
            local_5e0 = pMVar4;
            local_280 = pMVar6;
            if (local_a08.allocator == (Allocator *)0x0) {
              local_98 = local_a08.data;
              if (local_a08.data != (void *)0x0) {
                free(local_a08.data);
              }
            }
            else {
              (*(local_a08.allocator)->_vptr_Allocator[3])(local_a08.allocator,local_a08.data);
            }
          }
        }
        pMVar6->data = (void *)0x0;
        pMVar6->elemsize = 0;
        pMVar6->elempack = 0;
        pMVar6->dims = 0;
        pMVar6->w = 0;
        pMVar6->h = 0;
        pMVar6->d = 0;
        pMVar6->c = 0;
        pMVar6->cstep = 0;
        pMVar6->refcount = (int *)0x0;
        uVar2 = *(undefined8 *)(in_RDI + 0x2c8);
        iVar7 = *(int *)(in_RDI + 0x2c0);
        local_3c0 = *(undefined4 **)(in_RDI + 0x288);
        for (local_3c4 = 0; local_3c4 < (int)uVar2 * iVar7; local_3c4 = local_3c4 + 1) {
          *local_3c0 = local_9bc;
          local_3c0 = local_3c0 + 1;
        }
      }
      local_6ac = 0;
    }
  }
  else {
    local_6ac = 0;
  }
  return local_6ac;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

    return 0;
}